

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_template.c
# Opt level: O0

void * drawnumber_new(t_symbol *classsym,int argc,t_atom *argv)

{
  int iVar1;
  t_pd *pp_Var2;
  _glist *p_Var3;
  t_symbol *ptVar4;
  t_pd p_Var5;
  t_symbol *firstarg;
  char *classname;
  t_drawnumber *x;
  t_atom *argv_local;
  int argc_local;
  t_symbol *classsym_local;
  
  pp_Var2 = pd_new(drawnumber_class);
  fielddesc_setfloat_const((_fielddesc *)(pp_Var2 + 0x16),1.0);
  p_Var3 = canvas_getcurrent();
  pp_Var2[0x1c] = (t_pd)p_Var3;
  x = (t_drawnumber *)argv;
  argv_local._4_4_ = argc;
  while( true ) {
    ptVar4 = atom_getsymbolarg(0,argv_local._4_4_,(t_atom *)x);
    iVar1 = strcmp(ptVar4->s_name,"-v");
    if ((iVar1 != 0) || (argv_local._4_4_ < 2)) break;
    fielddesc_setfloatarg((_fielddesc *)(pp_Var2 + 0x16),1,(t_atom *)&(x->x_obj).te_binbuf);
    argv_local._4_4_ = argv_local._4_4_ + -2;
    x = (t_drawnumber *)&(x->x_obj).te_inlet;
  }
  p_Var5 = (t_pd)atom_getsymbolarg(0,argv_local._4_4_,(t_atom *)x);
  pp_Var2[6] = p_Var5;
  if (argv_local._4_4_ != 0) {
    argv_local._4_4_ = argv_local._4_4_ + -1;
    x = (t_drawnumber *)&(x->x_obj).te_binbuf;
  }
  if (argv_local._4_4_ == 0) {
    fielddesc_setfloat_const((_fielddesc *)(pp_Var2 + 7),0.0);
  }
  else {
    fielddesc_setfloatarg((_fielddesc *)(pp_Var2 + 7),argv_local._4_4_,(t_atom *)x);
    x = (t_drawnumber *)&(x->x_obj).te_binbuf;
    argv_local._4_4_ = argv_local._4_4_ + -1;
  }
  if (argv_local._4_4_ == 0) {
    fielddesc_setfloat_const((_fielddesc *)(pp_Var2 + 0xc),0.0);
  }
  else {
    fielddesc_setfloatarg((_fielddesc *)(pp_Var2 + 0xc),argv_local._4_4_,(t_atom *)x);
    x = (t_drawnumber *)&(x->x_obj).te_binbuf;
    argv_local._4_4_ = argv_local._4_4_ + -1;
  }
  if (argv_local._4_4_ == 0) {
    fielddesc_setfloat_const((_fielddesc *)(pp_Var2 + 0x11),1.0);
  }
  else {
    fielddesc_setfloatarg((_fielddesc *)(pp_Var2 + 0x11),argv_local._4_4_,(t_atom *)x);
    x = (t_drawnumber *)&(x->x_obj).te_binbuf;
    argv_local._4_4_ = argv_local._4_4_ + -1;
  }
  if (argv_local._4_4_ == 0) {
    pp_Var2[0x1b] = (t_pd)&s_;
  }
  else {
    p_Var5 = (t_pd)atom_getsymbolarg(0,argv_local._4_4_,(t_atom *)x);
    pp_Var2[0x1b] = p_Var5;
  }
  return pp_Var2;
}

Assistant:

static void *drawnumber_new(t_symbol *classsym, int argc, t_atom *argv)
{
    t_drawnumber *x = (t_drawnumber *)pd_new(drawnumber_class);
    const char *classname = classsym->s_name;

    fielddesc_setfloat_const(&x->x_vis, 1);
    x->x_canvas = canvas_getcurrent();
    while (1)
    {
        t_symbol *firstarg = atom_getsymbolarg(0, argc, argv);
        if (!strcmp(firstarg->s_name, "-v") && argc > 1)
        {
            fielddesc_setfloatarg(&x->x_vis, 1, argv+1);
            argc -= 2; argv += 2;
        }
        else break;
    }
        /* next argument is name of field to draw - we don't know its type yet
        but fielddesc_setfloatarg() will do fine here. */
    x->x_fieldname = atom_getsymbolarg(0, argc, argv);
    if (argc)
        argc--, argv++;
    if (argc) fielddesc_setfloatarg(&x->x_xloc, argc--, argv++);
    else fielddesc_setfloat_const(&x->x_xloc, 0);
    if (argc) fielddesc_setfloatarg(&x->x_yloc, argc--, argv++);
    else fielddesc_setfloat_const(&x->x_yloc, 0);
    if (argc) fielddesc_setfloatarg(&x->x_color, argc--, argv++);
    else fielddesc_setfloat_const(&x->x_color, 1);
    if (argc)
        x->x_label = atom_getsymbolarg(0, argc, argv);
    else x->x_label = &s_;

    return (x);
}